

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O2

void Nwk_ManRemoveDupFanins(Nwk_Man_t *pNtk,int fVerbose)

{
  uint uVar1;
  Nwk_Obj_t *pNVar2;
  Nwk_Obj_t *pNVar3;
  Vec_Int_t *p;
  Nwk_Obj_t *pObj;
  ulong uVar4;
  long lVar5;
  uint iFan1;
  ulong uVar6;
  int i;
  long lVar7;
  ulong uVar8;
  
  p = Vec_IntAlloc(0x10000);
  i = 0;
  do {
    if (pNtk->vObjs->nSize <= i) {
      Vec_IntFree(p);
      return;
    }
    pObj = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vObjs,i);
    if ((pObj != (Nwk_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x20 & 7) == 3)) {
      uVar1 = pObj->nFanins;
      uVar4 = 0;
      if (0 < (int)uVar1) {
        uVar4 = (ulong)uVar1;
      }
      lVar5 = 8;
      uVar8 = 0;
      while (uVar8 != uVar4) {
        uVar6 = uVar8 & 0xffffffff;
        lVar7 = lVar5;
        while( true ) {
          iFan1 = (int)uVar6 + 1;
          uVar6 = (ulong)iFan1;
          if ((int)uVar1 <= (int)iFan1) break;
          pNVar2 = pObj->pFanio[uVar8];
          pNVar3 = *(Nwk_Obj_t **)((long)pObj->pFanio + lVar7);
          lVar7 = lVar7 + 8;
          if (pNVar2 == pNVar3) {
            if (fVerbose != 0) {
              printf("Removing duplicated fanins of node %d (fanins %d and %d).\n",
                     (ulong)(uint)pObj->Id,(ulong)(uint)pNVar2->Id,(ulong)(uint)pNVar3->Id);
            }
            Nwk_ManRemoveDupFaninsNode(pObj,(int)uVar8,iFan1,p);
            goto LAB_0041f495;
          }
        }
        lVar5 = lVar5 + 8;
        uVar8 = uVar8 + 1;
      }
    }
LAB_0041f495:
    i = i + 1;
  } while( true );
}

Assistant:

void Nwk_ManRemoveDupFanins( Nwk_Man_t * pNtk, int fVerbose )
{
    Vec_Int_t * vTruth;
    Nwk_Obj_t * pObj;
    int i, k, m, fFound;
    // check if the nodes have duplicated fanins
    vTruth = Vec_IntAlloc( 1 << 16 );
    Nwk_ManForEachNode( pNtk, pObj, i )
    {
        fFound = 0;
        for ( k = 0; k < pObj->nFanins; k++ )
        {
            for ( m = k + 1; m < pObj->nFanins; m++ )
                if ( pObj->pFanio[k] == pObj->pFanio[m] )
                {
                    if ( fVerbose )
                        printf( "Removing duplicated fanins of node %d (fanins %d and %d).\n", 
                            pObj->Id, pObj->pFanio[k]->Id, pObj->pFanio[m]->Id );
                    Nwk_ManRemoveDupFaninsNode( pObj, k, m, vTruth );
                    fFound = 1;
                    break;
                }
            if ( fFound )
                break;
        }
    }
    Vec_IntFree( vTruth );
//    Nwk_ManMinimumBase( pNtk, fVerbose );
}